

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O0

int __thiscall QSwipeGesture::qt_metacall(QSwipeGesture *this,Call _c,int _id,void **_a)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  void **unaff_retaddr;
  int local_4;
  
  local_4 = QGesture::qt_metacall
                      ((QGesture *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),(int)in_RCX
                       ,in_RDI);
  if ((-1 < local_4) &&
     ((((in_ESI == 1 || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))))) {
    qt_static_metacall((QObject *)CONCAT44(_c,_id),_a._4_4_,(int)_a,unaff_retaddr);
    local_4 = local_4 + -4;
  }
  return local_4;
}

Assistant:

int QSwipeGesture::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QGesture::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}